

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O3

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m)

{
  ulong uVar1;
  double dVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double adStack_40 [3];
  
  pdVar3 = (double *)((long)adStack_40 + (8 - ((long)(m + 1) * 8 + 0xfU & 0xfffffffffffffff0)));
  lVar5 = (long)m;
  pdVar14 = (double *)((long)pdVar3 - (lVar5 * 8 + 0xfU & 0xfffffffffffffff0));
  if (m == -1) {
    dVar18 = NAN;
  }
  else {
    lVar8 = lVar5 * 4;
    do {
      dVar16 = 0.0;
      pfVar9 = data;
      for (lVar10 = lVar5; lVar10 < n; lVar10 = lVar10 + 1) {
        dVar16 = dVar16 + (double)*pfVar9 * (double)*(float *)((long)pfVar9 + lVar8);
        pfVar9 = pfVar9 + 1;
      }
      pdVar3[lVar5] = dVar16;
      lVar8 = lVar8 + -4;
      bVar15 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while (bVar15);
    dVar16 = *pdVar3;
    dVar18 = dVar16 * 1.0000000001;
    if (0 < m) {
      uVar13 = (ulong)(uint)m;
      pdVar6 = pdVar14 + -1;
      pdVar7 = pdVar3;
      uVar4 = 0;
      do {
        if (dVar18 < dVar16 * 1e-09 + 1e-10) {
          adStack_40[2] = dVar18;
          pdVar14[-1] = 2.96764383886582e-317;
          memset(pdVar14 + (uVar4 & 0xffffffff),0,(long)(m - (int)uVar4) << 3);
          dVar18 = adStack_40[2];
          break;
        }
        uVar1 = uVar4 + 1;
        dVar17 = -pdVar3[uVar1];
        if (uVar4 == 0) {
          dVar17 = dVar17 / dVar18;
          *pdVar14 = dVar17;
        }
        else {
          uVar12 = 0;
          pdVar11 = pdVar7;
          do {
            dVar17 = dVar17 - *pdVar11 * pdVar14[uVar12];
            uVar12 = uVar12 + 1;
            pdVar11 = pdVar11 + -1;
          } while (uVar4 != uVar12);
          dVar17 = dVar17 / dVar18;
          pdVar14[uVar4] = dVar17;
          if (uVar4 == 1) {
            uVar12 = 0;
          }
          else {
            lVar5 = 0;
            pdVar11 = pdVar14;
            do {
              dVar2 = *pdVar11;
              *pdVar11 = pdVar6[lVar5] * dVar17 + dVar2;
              pdVar6[lVar5] = dVar2 * dVar17 + pdVar6[lVar5];
              pdVar11 = pdVar11 + 1;
              lVar5 = lVar5 + -1;
            } while (-(ulong)(uVar4 >> 1 == 0) - (uVar4 >> 1) != lVar5);
            uVar12 = (ulong)(((uint)(uVar4 >> 1) & 0x7fffffff) +
                            (uint)((uVar4 >> 1 & 0x7fffffff) == 0));
          }
          if ((uVar4 & 1) != 0) {
            pdVar14[uVar12] = pdVar14[uVar12] * dVar17 + pdVar14[uVar12];
          }
        }
        dVar18 = (1.0 - dVar17 * dVar17) * dVar18;
        pdVar7 = pdVar7 + 1;
        pdVar6 = pdVar6 + 1;
        uVar4 = uVar1;
      } while (uVar1 != uVar13);
      if (0 < m) {
        uVar4 = 0;
        dVar16 = 0.99;
        do {
          pdVar14[uVar4] = pdVar14[uVar4] * dVar16;
          dVar16 = dVar16 * 0.99;
          uVar4 = uVar4 + 1;
        } while (uVar13 != uVar4);
        uVar4 = 0;
        do {
          lpci[uVar4] = (float)pdVar14[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar13 != uVar4);
      }
    }
  }
  return (float)dVar18;
}

Assistant:

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m){
  double *aut=alloca(sizeof(*aut)*(m+1));
  double *lpc=alloca(sizeof(*lpc)*(m));
  double error;
  double epsilon;
  int i,j;

  /* autocorrelation, p+1 lag coefficients */
  j=m+1;
  while(j--){
    double d=0; /* double needed for accumulator depth */
    for(i=j;i<n;i++)d+=(double)data[i]*data[(i-j)];
    aut[j]=d;
  }

  /* Generate lpc coefficients from autocorr values */

  /* set our noise floor to about -100dB */
  error=aut[0] * (1. + 1e-10);
  epsilon=1e-9*aut[0]+1e-10;

  for(i=0;i<m;i++){
    double r= -aut[i+1];

    if(error<epsilon){
      memset(lpc+i,0,(m-i)*sizeof(*lpc));
      goto done;
    }

    /* Sum up this iteration's reflection coefficient; note that in
       Vorbis we don't save it.  If anyone wants to recycle this code
       and needs reflection coefficients, save the results of 'r' from
       each iteration. */

    for(j=0;j<i;j++)r-=lpc[j]*aut[i-j];
    r/=error;

    /* Update LPC coefficients and total error */

    lpc[i]=r;
    for(j=0;j<i/2;j++){
      double tmp=lpc[j];

      lpc[j]+=r*lpc[i-1-j];
      lpc[i-1-j]+=r*tmp;
    }
    if(i&1)lpc[j]+=lpc[j]*r;

    error*=1.-r*r;

  }

 done:

  /* slightly damp the filter */
  {
    double g = .99;
    double damp = g;
    for(j=0;j<m;j++){
      lpc[j]*=damp;
      damp*=g;
    }
  }

  for(j=0;j<m;j++)lpci[j]=(float)lpc[j];

  /* we need the error value to know how big an impulse to hit the
     filter with later */

  return (float)error;
}